

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressed_materialization.cpp
# Opt level: O2

void __thiscall
duckdb::CompressedMaterialization::Compress
          (CompressedMaterialization *this,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *op)

{
  LogicalOperatorType LVar1;
  bool bVar2;
  type op_00;
  pointer pLVar3;
  LogicalOperator *this_00;
  
  op_00 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
          operator*(op);
  bVar2 = TopN::CanOptimize(op_00);
  if (!bVar2) {
    pLVar3 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
             ::operator->(op);
    if (((ulong)pLVar3->type < 0x35) &&
       ((0x10000000000888U >> ((ulong)pLVar3->type & 0x3f) & 1) != 0)) {
      this_00 = optional_ptr<duckdb::LogicalOperator,_true>::operator->(&this->root);
      LogicalOperator::ResolveOperatorTypes(this_00);
      pLVar3 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               ::operator->(op);
      LVar1 = pLVar3->type;
      if (LVar1 == LOGICAL_COMPARISON_JOIN) {
        CompressComparisonJoin(this,op);
        return;
      }
      if (LVar1 == LOGICAL_ORDER_BY) {
        CompressOrder(this,op);
        return;
      }
      if (LVar1 == LOGICAL_DISTINCT) {
        CompressDistinct(this,op);
        return;
      }
      if (LVar1 == LOGICAL_AGGREGATE_AND_GROUP_BY) {
        CompressAggregate(this,op);
        return;
      }
    }
  }
  return;
}

Assistant:

void CompressedMaterialization::Compress(unique_ptr<LogicalOperator> &op) {
	if (TopN::CanOptimize(*op)) { // Let's not mess with the TopN optimizer
		return;
	}

	switch (op->type) {
	case LogicalOperatorType::LOGICAL_AGGREGATE_AND_GROUP_BY:
	case LogicalOperatorType::LOGICAL_COMPARISON_JOIN:
	case LogicalOperatorType::LOGICAL_DISTINCT:
	case LogicalOperatorType::LOGICAL_ORDER_BY:
		break;
	default:
		return;
	}

	root->ResolveOperatorTypes();

	switch (op->type) {
	case LogicalOperatorType::LOGICAL_AGGREGATE_AND_GROUP_BY:
		CompressAggregate(op);
		break;
	case LogicalOperatorType::LOGICAL_COMPARISON_JOIN:
		CompressComparisonJoin(op);
		break;
	case LogicalOperatorType::LOGICAL_DISTINCT:
		CompressDistinct(op);
		break;
	case LogicalOperatorType::LOGICAL_ORDER_BY:
		CompressOrder(op);
		break;
	default:
		break;
	}
}